

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_Thing_Stop(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  player_t *ppVar1;
  int iVar2;
  AActor *pAVar3;
  TActorIterator<AActor> local_18;
  
  if (arg0 == 0) {
    if (it == (AActor *)0x0) {
      return 0;
    }
    (it->Vel).X = 0.0;
    (it->Vel).Y = 0.0;
    (it->Vel).Z = 0.0;
    ppVar1 = it->player;
    iVar2 = 1;
    if (ppVar1 != (player_t *)0x0) {
      (ppVar1->Vel).X = 0.0;
      (ppVar1->Vel).Y = 0.0;
      return 1;
    }
  }
  else {
    local_18.super_FActorIterator.base = (AActor *)0x0;
    local_18.super_FActorIterator.id = arg0;
    pAVar3 = TActorIterator<AActor>::Next(&local_18);
    if (pAVar3 == (AActor *)0x0) {
      iVar2 = 0;
    }
    else {
      do {
        (pAVar3->Vel).X = 0.0;
        (pAVar3->Vel).Y = 0.0;
        (pAVar3->Vel).Z = 0.0;
        ppVar1 = pAVar3->player;
        if (ppVar1 != (player_t *)0x0) {
          (ppVar1->Vel).X = 0.0;
          (ppVar1->Vel).Y = 0.0;
        }
        pAVar3 = TActorIterator<AActor>::Next(&local_18);
      } while (pAVar3 != (AActor *)0x0);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

FUNC(LS_Thing_Stop)
// Thing_Stop(tid)
{
	AActor * target;
	bool ok = false;

	if (arg0==0)
	{
		if (it != NULL)
		{
			it->Vel.Zero();
			if (it->player != NULL) it->player->Vel.Zero();
			ok = true;
		}
	}
	else
	{
		TActorIterator<AActor> iterator (arg0);

		while ( (target = iterator.Next ()) )
		{
			target->Vel.Zero();
			if (target->player != NULL) target->player->Vel.Zero();
			ok = true;
		}
	}
	return ok;
}